

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv.hpp
# Opt level: O3

csv<plus_triple> * argagg::convert::converter<argagg::csv<plus_triple>_>::convert(char *s)

{
  pointer *pppVar1;
  iterator __position;
  plus_triple *ppVar2;
  bool bVar3;
  vector<plus_triple,_std::allocator<plus_triple>_> *in_RDI;
  plus_triple value;
  plus_triple local_38;
  char *local_20;
  
  (in_RDI->super__Vector_base<plus_triple,_std::allocator<plus_triple>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->super__Vector_base<plus_triple,_std::allocator<plus_triple>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (in_RDI->super__Vector_base<plus_triple,_std::allocator<plus_triple>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while( true ) {
    bVar3 = parse_next_component<plus_triple>(&local_20,&local_38,',');
    __position._M_current =
         (in_RDI->super__Vector_base<plus_triple,_std::allocator<plus_triple>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    ppVar2 = (in_RDI->super__Vector_base<plus_triple,_std::allocator<plus_triple>_>)._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    if (!bVar3) break;
    if (__position._M_current == ppVar2) {
      std::vector<plus_triple,_std::allocator<plus_triple>_>::_M_realloc_insert<plus_triple>
                (in_RDI,__position,&local_38);
    }
    else {
      (__position._M_current)->z = local_38.z;
      (__position._M_current)->x = local_38.x;
      (__position._M_current)->y = local_38.y;
      pppVar1 = &(in_RDI->super__Vector_base<plus_triple,_std::allocator<plus_triple>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      *pppVar1 = *pppVar1 + 1;
    }
  }
  if (__position._M_current == ppVar2) {
    std::vector<plus_triple,_std::allocator<plus_triple>_>::_M_realloc_insert<plus_triple>
              (in_RDI,__position,&local_38);
  }
  else {
    (__position._M_current)->z = local_38.z;
    (__position._M_current)->x = local_38.x;
    (__position._M_current)->y = local_38.y;
    pppVar1 = &(in_RDI->super__Vector_base<plus_triple,_std::allocator<plus_triple>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *pppVar1 = *pppVar1 + 1;
  }
  return (csv<plus_triple> *)in_RDI;
}

Assistant:

csv<T>
converter<csv<T>>::convert(const char* s)
{
  csv<T> result {{}};
  T value;
  while (parse_next_component(s, value, ',')) {
    result.values.emplace_back(std::move(value));
  }
  result.values.emplace_back(std::move(value));
  return result;
}